

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pizza_cutter.cpp
# Opt level: O2

void __thiscall pizza_cutter::try_to_create_slices_for_each_point(pizza_cutter *this)

{
  pointer pvVar1;
  ulong uVar2;
  ulong uVar3;
  optional<pizza_slice> slice;
  
  pvVar1 = (this->pizza_).
           super__Vector_base<std::vector<pizza_cell,_std::allocator<pizza_cell>_>,_std::allocator<std::vector<pizza_cell,_std::allocator<pizza_cell>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  uVar3 = 0;
  do {
    if ((ulong)(((long)(this->pizza_).
                       super__Vector_base<std::vector<pizza_cell,_std::allocator<pizza_cell>_>,_std::allocator<std::vector<pizza_cell,_std::allocator<pizza_cell>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar1) / 0x18) <= uVar3)
    {
      return;
    }
    for (uVar2 = 0;
        uVar2 < (ulong)((long)*(pointer *)
                               ((long)&(pvVar1->
                                       super__Vector_base<pizza_cell,_std::allocator<pizza_cell>_>).
                                       _M_impl.super__Vector_impl_data + 8) -
                        *(long *)&(pvVar1->
                                  super__Vector_base<pizza_cell,_std::allocator<pizza_cell>_>).
                                  _M_impl.super__Vector_impl_data >> 3); uVar2 = uVar2 + 1) {
      create_slice_for(&slice,this,(int)uVar3,(int)uVar2);
      if (slice.super__Optional_base<pizza_slice,_true,_true>._M_payload.
          super__Optional_payload_base<pizza_slice>._M_engaged == true) {
        mark_slice(this,slice.super__Optional_base<pizza_slice,_true,_true>._M_payload.
                        super__Optional_payload_base<pizza_slice>._M_payload._M_value,
                   (int)((ulong)((long)(this->slices_).
                                       super__Vector_base<pizza_slice,_std::allocator<pizza_slice>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                (long)(this->slices_).
                                      super__Vector_base<pizza_slice,_std::allocator<pizza_slice>_>.
                                      _M_impl.super__Vector_impl_data._M_start) >> 4));
        if (slice.super__Optional_base<pizza_slice,_true,_true>._M_payload.
            super__Optional_payload_base<pizza_slice>._M_engaged == false) {
          std::__throw_bad_optional_access();
        }
        std::vector<pizza_slice,_std::allocator<pizza_slice>_>::push_back
                  (&this->slices_,(value_type *)&slice);
      }
      pvVar1 = (this->pizza_).
               super__Vector_base<std::vector<pizza_cell,_std::allocator<pizza_cell>_>,_std::allocator<std::vector<pizza_cell,_std::allocator<pizza_cell>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
    }
    uVar3 = uVar3 + 1;
  } while( true );
}

Assistant:

void pizza_cutter::try_to_create_slices_for_each_point() noexcept
{
    for (int row = 0; row < pizza_.size(); row++) {
        for (int col = 0; col < pizza_[0].size(); col++) {
            auto slice = create_slice_for(row, col);
            if (!slice) continue;
            int next_slice_id = slices_.size();
            mark_slice(slice.value(), next_slice_id);
            slices_.push_back(slice.value());
        }
    }
}